

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool google::anon_unknown_1::AddFlagValidator(void *flag_ptr,ValidateFnProto validate_fn_proto)

{
  _Base_ptr p_Var1;
  FlagRegistry *pFVar2;
  iterator iVar3;
  ostream *poVar4;
  void **in_RCX;
  bool bVar5;
  char *pcVar6;
  _Rb_tree_header *__x;
  void *local_30;
  
  pFVar2 = FlagRegistry::GlobalRegistry();
  gflags_mutex_namespace::Mutex::Lock(&pFVar2->lock_);
  __x = &(pFVar2->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  local_30 = flag_ptr;
  iVar3 = std::
          _Rb_tree<const_void_*,_std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
          ::_M_lower_bound((_Rb_tree<const_void_*,_std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
                            *)(pFVar2->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,(_Link_type)__x,(_Base_ptr)&local_30,in_RCX);
  if ((((_Rb_tree_header *)iVar3._M_node == __x) || (flag_ptr < *(void **)(iVar3._M_node + 1))) ||
     (p_Var1 = iVar3._M_node[1]._M_parent, p_Var1 == (_Base_ptr)0x0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Ignoring RegisterValidateFunction() for flag pointer ");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    pcVar6 = ": no flag found at that address";
  }
  else {
    bVar5 = true;
    if (p_Var1[1]._M_left == (_Base_ptr)validate_fn_proto) goto LAB_001922e8;
    if ((validate_fn_proto == (ValidateFnProto)0x0) || (p_Var1[1]._M_left == (_Base_ptr)0x0)) {
      p_Var1[1]._M_left = (_Base_ptr)validate_fn_proto;
      goto LAB_001922e8;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Ignoring RegisterValidateFunction() for flag \'"
                            );
    poVar4 = std::operator<<(poVar4,*(char **)p_Var1);
    pcVar6 = "\': validate-fn already registered";
  }
  std::operator<<(poVar4,pcVar6);
  bVar5 = false;
LAB_001922e8:
  gflags_mutex_namespace::Mutex::Unlock(&pFVar2->lock_);
  return bVar5;
}

Assistant:

bool AddFlagValidator(const void* flag_ptr, ValidateFnProto validate_fn_proto) {
  // We want a lock around this routine, in case two threads try to
  // add a validator (hopefully the same one!) at once.  We could use
  // our own thread, but we need to loook at the registry anyway, so
  // we just steal that one.
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  // First, find the flag whose current-flag storage is 'flag'.
  // This is the CommandLineFlag whose current_->value_buffer_ == flag
  CommandLineFlag* flag = registry->FindFlagViaPtrLocked(flag_ptr);
  if (!flag) {
    LOG(WARNING) << "Ignoring RegisterValidateFunction() for flag pointer "
                 << flag_ptr << ": no flag found at that address";
    return false;
  } else if (validate_fn_proto == flag->validate_function()) {
    return true;    // ok to register the same function over and over again
  } else if (validate_fn_proto != NULL && flag->validate_function() != NULL) {
    LOG(WARNING) << "Ignoring RegisterValidateFunction() for flag '"
                 << flag->name() << "': validate-fn already registered";
    return false;
  } else {
    flag->validate_fn_proto_ = validate_fn_proto;
    return true;
  }
}